

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCacheStore(Parse *pParse,int iTab,int iCol,int iReg)

{
  ulong uVar1;
  yColCache *pyVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  bool bVar6;
  
  if ((pParse->db->dbOptFlags & 2) == 0) {
    iVar3 = 10;
    pyVar2 = pParse->aColCache;
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      if (pyVar2->iReg == 0) goto LAB_0015e431;
      pyVar2 = pyVar2 + 1;
    }
    piVar4 = &pParse->aColCache[0].lru;
    uVar1 = 0xffffffff;
    iVar3 = 0x7fffffff;
    for (uVar5 = 0; uVar5 != 10; uVar5 = uVar5 + 1) {
      if (*piVar4 < iVar3) {
        uVar1 = (ulong)uVar5;
        iVar3 = *piVar4;
      }
      piVar4 = piVar4 + 6;
    }
    if (-1 < (int)uVar1) {
      pyVar2 = pParse->aColCache + uVar1;
LAB_0015e431:
      pyVar2->iLevel = pParse->iCacheLevel;
      pyVar2->iTable = iTab;
      pyVar2->iColumn = iCol;
      pyVar2->iReg = iReg;
      pyVar2->tempReg = '\0';
      iVar3 = pParse->iCacheCnt;
      pParse->iCacheCnt = iVar3 + 1;
      pyVar2->lru = iVar3;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheStore(Parse *pParse, int iTab, int iCol, int iReg){
  int i;
  int minLru;
  int idxLru;
  struct yColCache *p;

  assert( iReg>0 );  /* Register numbers are always positive */
  assert( iCol>=-1 && iCol<32768 );  /* Finite column numbers */

  /* The SQLITE_ColumnCache flag disables the column cache.  This is used
  ** for testing only - to verify that SQLite always gets the same answer
  ** with and without the column cache.
  */
  if( OptimizationDisabled(pParse->db, SQLITE_ColumnCache) ) return;

  /* First replace any existing entry.
  **
  ** Actually, the way the column cache is currently used, we are guaranteed
  ** that the object will never already be in cache.  Verify this guarantee.
  */
#ifndef NDEBUG
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    assert( p->iReg==0 || p->iTable!=iTab || p->iColumn!=iCol );
  }
#endif

  /* Find an empty slot and replace it */
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->iReg==0 ){
      p->iLevel = pParse->iCacheLevel;
      p->iTable = iTab;
      p->iColumn = iCol;
      p->iReg = iReg;
      p->tempReg = 0;
      p->lru = pParse->iCacheCnt++;
      return;
    }
  }

  /* Replace the last recently used */
  minLru = 0x7fffffff;
  idxLru = -1;
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->lru<minLru ){
      idxLru = i;
      minLru = p->lru;
    }
  }
  if( ALWAYS(idxLru>=0) ){
    p = &pParse->aColCache[idxLru];
    p->iLevel = pParse->iCacheLevel;
    p->iTable = iTab;
    p->iColumn = iCol;
    p->iReg = iReg;
    p->tempReg = 0;
    p->lru = pParse->iCacheCnt++;
    return;
  }
}